

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Memory> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
          (RefPtr<wabt::interp::Memory> *__return_storage_ptr__,Store *this,Store *args,
          MemoryType *args_1)

{
  uint64_t uVar1;
  Memory *this_00;
  Ref ref;
  Memory *local_68;
  MemoryType local_60;
  
  this_00 = (Memory *)operator_new(0x90);
  local_60.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e0c40;
  local_60.limits.initial = (args_1->limits).initial;
  uVar1 = (args_1->limits).max;
  local_60._36_8_ = *(undefined8 *)&(args_1->limits).field_0x14;
  local_60.limits._16_4_ = SUB84((ulong)*(undefined8 *)((long)&(args_1->limits).max + 4) >> 0x20,0);
  local_60.limits.max._0_4_ = (undefined4)uVar1;
  local_60.limits.max._4_4_ = (undefined4)(uVar1 >> 0x20);
  Memory::Memory(this_00,args,&local_60);
  local_68 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Memory*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_68);
  RefPtr<wabt::interp::Memory>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}